

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O2

int Gia_ManBmciTest(Gia_Man_t *p,Vec_Int_t *vInit,int nFrames,int nWords,int nTimeOut,int fSim,
                   int fVerbose)

{
  int nCap;
  Vec_Int_t *vInit1;
  int nWords_00;
  
  nCap = p->nRegs;
  nWords_00 = nTimeOut;
  vInit1 = Vec_IntAlloc(nCap);
  vInit1->nSize = nCap;
  if (vInit1->pArray != (int *)0x0) {
    memset(vInit1->pArray,0,(long)nCap << 2);
  }
  Bmc_BmciPerform(p,vInit,vInit1,nFrames,nWords_00,nTimeOut,fVerbose);
  Vec_IntFree(vInit1);
  return 1;
}

Assistant:

int Gia_ManBmciTest( Gia_Man_t * p, Vec_Int_t * vInit, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose )
{
    Vec_Int_t * vInit0 = Vec_IntStart( Gia_ManRegNum(p) );
    Bmc_BmciPerform( p, vInit, vInit0, nFrames, nWords, nTimeOut, fVerbose );
    Vec_IntFree( vInit0 );
    return 1;
}